

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  ulong uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  ulong *puVar70;
  int iVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  undefined4 uVar82;
  ulong unaff_R14;
  size_t mask;
  ulong uVar83;
  bool bVar84;
  bool bVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 extraout_var [56];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar116;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar136;
  float fVar137;
  undefined1 auVar132 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar138;
  undefined1 auVar135 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_ea0;
  RTCFilterFunctionNArguments local_cf0;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [32];
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  undefined4 uStack_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar98 [64];
  
  local_ea0 = local_7f8;
  local_800 = root.ptr;
  uVar82 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar128._4_4_ = uVar82;
  auVar128._0_4_ = uVar82;
  auVar128._8_4_ = uVar82;
  auVar128._12_4_ = uVar82;
  uVar82 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar132._4_4_ = uVar82;
  auVar132._0_4_ = uVar82;
  auVar132._8_4_ = uVar82;
  auVar132._12_4_ = uVar82;
  uVar82 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar142._4_4_ = uVar82;
  auVar142._0_4_ = uVar82;
  auVar142._8_4_ = uVar82;
  auVar142._12_4_ = uVar82;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar35 = fVar1 * 0.99999964;
  fVar36 = fVar2 * 0.99999964;
  fVar37 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar71 = (tray->tnear).field_0.i[k];
  auVar106._4_4_ = iVar71;
  auVar106._0_4_ = iVar71;
  auVar106._8_4_ = iVar71;
  auVar106._12_4_ = iVar71;
  iVar71 = (tray->tfar).field_0.i[k];
  auVar111._4_4_ = iVar71;
  auVar111._0_4_ = iVar71;
  auVar111._8_4_ = iVar71;
  auVar111._12_4_ = iVar71;
  local_c60._16_16_ = mm_lookupmask_ps._240_16_;
  local_c60._0_16_ = mm_lookupmask_ps._0_16_;
  iVar71 = 1 << ((uint)k & 0x1f);
  auVar87._4_4_ = iVar71;
  auVar87._0_4_ = iVar71;
  auVar87._8_4_ = iVar71;
  auVar87._12_4_ = iVar71;
  auVar87._16_4_ = iVar71;
  auVar87._20_4_ = iVar71;
  auVar87._24_4_ = iVar71;
  auVar87._28_4_ = iVar71;
  auVar88 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar87 = vpand_avx2(auVar87,auVar88);
  local_ca0 = vpcmpeqd_avx2(auVar87,auVar88);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = &DAT_3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar88._8_4_ = 0xbf800000;
  auVar88._0_8_ = 0xbf800000bf800000;
  auVar88._12_4_ = 0xbf800000;
  auVar88._16_4_ = 0xbf800000;
  auVar88._20_4_ = 0xbf800000;
  auVar88._24_4_ = 0xbf800000;
  auVar88._28_4_ = 0xbf800000;
  _local_c80 = vblendvps_avx(auVar94,auVar88,local_c60);
  do {
    puVar70 = local_ea0;
    if (local_ea0 == &local_800) break;
    uVar78 = local_ea0[-1];
    local_ea0 = local_ea0 + -1;
    do {
      if ((uVar78 & 8) == 0) {
        auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar78 + 0x20 + uVar79),auVar128);
        auVar86._0_4_ = fVar35 * auVar38._0_4_;
        auVar86._4_4_ = fVar35 * auVar38._4_4_;
        auVar86._8_4_ = fVar35 * auVar38._8_4_;
        auVar86._12_4_ = fVar35 * auVar38._12_4_;
        auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar78 + 0x20 + uVar83),auVar132);
        auVar91._0_4_ = fVar36 * auVar38._0_4_;
        auVar91._4_4_ = fVar36 * auVar38._4_4_;
        auVar91._8_4_ = fVar36 * auVar38._8_4_;
        auVar91._12_4_ = fVar36 * auVar38._12_4_;
        auVar38 = vmaxps_avx(auVar86,auVar91);
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar78 + 0x20 + uVar80),auVar142);
        auVar92._0_4_ = fVar37 * auVar86._0_4_;
        auVar92._4_4_ = fVar37 * auVar86._4_4_;
        auVar92._8_4_ = fVar37 * auVar86._8_4_;
        auVar92._12_4_ = fVar37 * auVar86._12_4_;
        auVar86 = vmaxps_avx(auVar92,auVar106);
        auVar38 = vmaxps_avx(auVar38,auVar86);
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar78 + 0x20 + (uVar79 ^ 0x10)),auVar128);
        auVar93._0_4_ = fVar1 * auVar86._0_4_;
        auVar93._4_4_ = fVar1 * auVar86._4_4_;
        auVar93._8_4_ = fVar1 * auVar86._8_4_;
        auVar93._12_4_ = fVar1 * auVar86._12_4_;
        auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar78 + 0x20 + (uVar83 ^ 0x10)),auVar132);
        auVar99._0_4_ = fVar2 * auVar86._0_4_;
        auVar99._4_4_ = fVar2 * auVar86._4_4_;
        auVar99._8_4_ = fVar2 * auVar86._8_4_;
        auVar99._12_4_ = fVar2 * auVar86._12_4_;
        auVar86 = vminps_avx(auVar93,auVar99);
        auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar78 + 0x20 + (uVar80 ^ 0x10)),auVar142);
        auVar100._0_4_ = fVar3 * auVar91._0_4_;
        auVar100._4_4_ = fVar3 * auVar91._4_4_;
        auVar100._8_4_ = fVar3 * auVar91._8_4_;
        auVar100._12_4_ = fVar3 * auVar91._12_4_;
        auVar91 = vminps_avx(auVar100,auVar111);
        auVar86 = vminps_avx(auVar86,auVar91);
        auVar38 = vcmpps_avx(auVar38,auVar86,2);
        uVar82 = vmovmskps_avx(auVar38);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar82);
      }
      if ((uVar78 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar72 = 4;
        }
        else {
          uVar77 = uVar78 & 0xfffffffffffffff0;
          lVar75 = 0;
          for (uVar78 = unaff_R14; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
            lVar75 = lVar75 + 1;
          }
          for (uVar73 = unaff_R14 - 1 & unaff_R14; uVar78 = *(ulong *)(uVar77 + lVar75 * 8),
              uVar73 != 0; uVar73 = uVar73 - 1 & uVar73) {
            *local_ea0 = uVar78;
            local_ea0 = local_ea0 + 1;
            lVar75 = 0;
            for (uVar78 = uVar73; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
              lVar75 = lVar75 + 1;
            }
          }
          uVar72 = 0;
        }
      }
      else {
        uVar72 = 6;
      }
    } while (uVar72 == 0);
    if (uVar72 == 6) {
      uVar77 = (ulong)((uint)uVar78 & 0xf);
      uVar72 = 0;
      uVar73 = uVar77 - 8;
      bVar84 = uVar77 != 8;
      if (bVar84) {
        uVar78 = uVar78 & 0xfffffffffffffff0;
        uVar77 = 0;
        do {
          lVar74 = uVar77 * 0x60;
          pSVar6 = context->scene;
          ppfVar7 = (pSVar6->vertices).items;
          pfVar8 = ppfVar7[*(uint *)(uVar78 + 0x40 + lVar74)];
          auVar101._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar78 + 0x20 + lVar74));
          auVar101._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar78 + lVar74));
          pfVar9 = ppfVar7[*(uint *)(uVar78 + 0x48 + lVar74)];
          auVar107._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar78 + 0x28 + lVar74));
          auVar107._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar78 + 8 + lVar74));
          pfVar10 = ppfVar7[*(uint *)(uVar78 + 0x44 + lVar74)];
          auVar117._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar78 + 0x24 + lVar74));
          auVar117._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar78 + 4 + lVar74));
          pfVar11 = ppfVar7[*(uint *)(uVar78 + 0x4c + lVar74)];
          auVar143._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar78 + 0x2c + lVar74));
          auVar143._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar78 + 0xc + lVar74));
          lVar75 = uVar78 + 0x40 + lVar74;
          local_b00 = *(undefined8 *)(lVar75 + 0x10);
          uStack_af8 = *(undefined8 *)(lVar75 + 0x18);
          uStack_af0 = local_b00;
          uStack_ae8 = uStack_af8;
          lVar75 = uVar78 + 0x50 + lVar74;
          local_b20 = *(undefined8 *)(lVar75 + 0x10);
          uStack_b18 = *(undefined8 *)(lVar75 + 0x18);
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar78 + 0x10 + lVar74))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar78 + 0x18 + lVar74)));
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar78 + 0x10 + lVar74))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar78 + 0x18 + lVar74)));
          auVar92 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar78 + 0x14 + lVar74)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar78 + 0x1c + lVar74)));
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar78 + 0x14 + lVar74)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar78 + 0x1c + lVar74)));
          auVar93 = vunpcklps_avx(auVar38,auVar86);
          auVar99 = vunpcklps_avx(auVar91,auVar92);
          auVar38 = vunpckhps_avx(auVar91,auVar92);
          auVar92 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar78 + 0x30 + lVar74))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar78 + 0x38 + lVar74)));
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar78 + 0x30 + lVar74))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar78 + 0x38 + lVar74)));
          auVar100 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar78 + 0x34 + lVar74)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar78 + 0x3c + lVar74)));
          auVar91 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar78 + 0x34 + lVar74)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar78 + 0x3c + lVar74)));
          auVar91 = vunpcklps_avx(auVar86,auVar91);
          auVar41 = vunpcklps_avx(auVar92,auVar100);
          auVar86 = vunpckhps_avx(auVar92,auVar100);
          uStack_b10 = local_b20;
          uStack_b08 = uStack_b18;
          auVar87 = vunpcklps_avx(auVar117,auVar143);
          auVar88 = vunpcklps_avx(auVar101,auVar107);
          auVar135 = vunpcklps_avx(auVar88,auVar87);
          auVar87 = vunpckhps_avx(auVar88,auVar87);
          auVar88 = vunpckhps_avx(auVar117,auVar143);
          auVar94 = vunpckhps_avx(auVar101,auVar107);
          auVar88 = vunpcklps_avx(auVar94,auVar88);
          auVar108._16_16_ = auVar99;
          auVar108._0_16_ = auVar99;
          auVar118._16_16_ = auVar38;
          auVar118._0_16_ = auVar38;
          auVar129._16_16_ = auVar93;
          auVar129._0_16_ = auVar93;
          auVar150._16_16_ = auVar41;
          auVar150._0_16_ = auVar41;
          auVar112._16_16_ = auVar86;
          auVar112._0_16_ = auVar86;
          uVar82 = *(undefined4 *)(ray + k * 4);
          auVar133._4_4_ = uVar82;
          auVar133._0_4_ = uVar82;
          auVar133._8_4_ = uVar82;
          auVar133._12_4_ = uVar82;
          auVar133._16_4_ = uVar82;
          auVar133._20_4_ = uVar82;
          auVar133._24_4_ = uVar82;
          auVar133._28_4_ = uVar82;
          uVar82 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar144._4_4_ = uVar82;
          auVar144._0_4_ = uVar82;
          auVar144._8_4_ = uVar82;
          auVar144._12_4_ = uVar82;
          auVar144._16_4_ = uVar82;
          auVar144._20_4_ = uVar82;
          auVar144._24_4_ = uVar82;
          auVar144._28_4_ = uVar82;
          auVar89._16_16_ = auVar91;
          auVar89._0_16_ = auVar91;
          uVar82 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar149._4_4_ = uVar82;
          auVar149._0_4_ = uVar82;
          auVar149._8_4_ = uVar82;
          auVar149._12_4_ = uVar82;
          auVar149._16_4_ = uVar82;
          auVar149._20_4_ = uVar82;
          auVar149._24_4_ = uVar82;
          auVar149._28_4_ = uVar82;
          auVar135 = vsubps_avx(auVar135,auVar133);
          auVar101 = vsubps_avx(auVar87,auVar144);
          local_b40 = vsubps_avx(auVar88,auVar149);
          auVar87 = vsubps_avx(auVar108,auVar133);
          auVar88 = vsubps_avx(auVar118,auVar144);
          auVar94 = vsubps_avx(auVar129,auVar149);
          auVar107 = vsubps_avx(auVar150,auVar133);
          auVar108 = vsubps_avx(auVar112,auVar144);
          auVar39 = vsubps_avx(auVar89,auVar149);
          local_b60 = vsubps_avx(auVar107,auVar135);
          local_ba0 = vsubps_avx(auVar108,auVar101);
          local_b80 = vsubps_avx(auVar39,local_b40);
          auVar90._0_4_ = auVar107._0_4_ + auVar135._0_4_;
          auVar90._4_4_ = auVar107._4_4_ + auVar135._4_4_;
          auVar90._8_4_ = auVar107._8_4_ + auVar135._8_4_;
          auVar90._12_4_ = auVar107._12_4_ + auVar135._12_4_;
          auVar90._16_4_ = auVar107._16_4_ + auVar135._16_4_;
          auVar90._20_4_ = auVar107._20_4_ + auVar135._20_4_;
          auVar90._24_4_ = auVar107._24_4_ + auVar135._24_4_;
          auVar90._28_4_ = auVar107._28_4_ + auVar135._28_4_;
          auVar109._0_4_ = auVar108._0_4_ + auVar101._0_4_;
          auVar109._4_4_ = auVar108._4_4_ + auVar101._4_4_;
          auVar109._8_4_ = auVar108._8_4_ + auVar101._8_4_;
          auVar109._12_4_ = auVar108._12_4_ + auVar101._12_4_;
          auVar109._16_4_ = auVar108._16_4_ + auVar101._16_4_;
          auVar109._20_4_ = auVar108._20_4_ + auVar101._20_4_;
          auVar109._24_4_ = auVar108._24_4_ + auVar101._24_4_;
          fVar116 = auVar101._28_4_;
          auVar109._28_4_ = auVar108._28_4_ + fVar116;
          fVar14 = local_b40._0_4_;
          auVar113._0_4_ = auVar39._0_4_ + fVar14;
          fVar15 = local_b40._4_4_;
          auVar113._4_4_ = auVar39._4_4_ + fVar15;
          fVar16 = local_b40._8_4_;
          auVar113._8_4_ = auVar39._8_4_ + fVar16;
          fVar17 = local_b40._12_4_;
          auVar113._12_4_ = auVar39._12_4_ + fVar17;
          fVar18 = local_b40._16_4_;
          auVar113._16_4_ = auVar39._16_4_ + fVar18;
          fVar19 = local_b40._20_4_;
          auVar113._20_4_ = auVar39._20_4_ + fVar19;
          fVar20 = local_b40._24_4_;
          auVar113._24_4_ = auVar39._24_4_ + fVar20;
          auVar113._28_4_ = auVar39._28_4_ + local_b40._28_4_;
          auVar40._4_4_ = local_b80._4_4_ * auVar109._4_4_;
          auVar40._0_4_ = local_b80._0_4_ * auVar109._0_4_;
          auVar40._8_4_ = local_b80._8_4_ * auVar109._8_4_;
          auVar40._12_4_ = local_b80._12_4_ * auVar109._12_4_;
          auVar40._16_4_ = local_b80._16_4_ * auVar109._16_4_;
          auVar40._20_4_ = local_b80._20_4_ * auVar109._20_4_;
          auVar40._24_4_ = local_b80._24_4_ * auVar109._24_4_;
          auVar40._28_4_ = auVar41._12_4_;
          auVar86 = vfmsub231ps_fma(auVar40,local_ba0,auVar113);
          auVar43._4_4_ = local_b60._4_4_ * auVar113._4_4_;
          auVar43._0_4_ = local_b60._0_4_ * auVar113._0_4_;
          auVar43._8_4_ = local_b60._8_4_ * auVar113._8_4_;
          auVar43._12_4_ = local_b60._12_4_ * auVar113._12_4_;
          auVar43._16_4_ = local_b60._16_4_ * auVar113._16_4_;
          auVar43._20_4_ = local_b60._20_4_ * auVar113._20_4_;
          auVar43._24_4_ = local_b60._24_4_ * auVar113._24_4_;
          auVar43._28_4_ = auVar113._28_4_;
          auVar38 = vfmsub231ps_fma(auVar43,local_b80,auVar90);
          auVar44._4_4_ = auVar90._4_4_ * local_ba0._4_4_;
          auVar44._0_4_ = auVar90._0_4_ * local_ba0._0_4_;
          auVar44._8_4_ = auVar90._8_4_ * local_ba0._8_4_;
          auVar44._12_4_ = auVar90._12_4_ * local_ba0._12_4_;
          auVar44._16_4_ = auVar90._16_4_ * local_ba0._16_4_;
          auVar44._20_4_ = auVar90._20_4_ * local_ba0._20_4_;
          auVar44._24_4_ = auVar90._24_4_ * local_ba0._24_4_;
          auVar44._28_4_ = auVar90._28_4_;
          auVar91 = vfmsub231ps_fma(auVar44,local_b60,auVar109);
          uVar82 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar147._4_4_ = uVar82;
          auVar147._0_4_ = uVar82;
          auVar147._8_4_ = uVar82;
          auVar147._12_4_ = uVar82;
          auVar147._16_4_ = uVar82;
          auVar147._20_4_ = uVar82;
          auVar147._24_4_ = uVar82;
          auVar147._28_4_ = uVar82;
          fVar4 = *(float *)(ray + k * 4 + 0xc0);
          auVar45._4_4_ = fVar4 * auVar91._4_4_;
          auVar45._0_4_ = fVar4 * auVar91._0_4_;
          auVar45._8_4_ = fVar4 * auVar91._8_4_;
          auVar45._12_4_ = fVar4 * auVar91._12_4_;
          auVar45._16_4_ = fVar4 * 0.0;
          auVar45._20_4_ = fVar4 * 0.0;
          auVar45._24_4_ = fVar4 * 0.0;
          auVar45._28_4_ = local_b80._28_4_;
          auVar38 = vfmadd231ps_fma(auVar45,auVar147,ZEXT1632(auVar38));
          uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar130._4_4_ = uVar82;
          auVar130._0_4_ = uVar82;
          auVar130._8_4_ = uVar82;
          auVar130._12_4_ = uVar82;
          auVar130._16_4_ = uVar82;
          auVar130._20_4_ = uVar82;
          auVar130._24_4_ = uVar82;
          auVar130._28_4_ = uVar82;
          auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar130,ZEXT1632(auVar86));
          local_bc0 = vsubps_avx(auVar101,auVar88);
          local_c00 = vsubps_avx(local_b40,auVar94);
          auVar110._0_4_ = auVar101._0_4_ + auVar88._0_4_;
          auVar110._4_4_ = auVar101._4_4_ + auVar88._4_4_;
          auVar110._8_4_ = auVar101._8_4_ + auVar88._8_4_;
          auVar110._12_4_ = auVar101._12_4_ + auVar88._12_4_;
          auVar110._16_4_ = auVar101._16_4_ + auVar88._16_4_;
          auVar110._20_4_ = auVar101._20_4_ + auVar88._20_4_;
          auVar110._24_4_ = auVar101._24_4_ + auVar88._24_4_;
          auVar110._28_4_ = fVar116 + auVar88._28_4_;
          auVar114._0_4_ = auVar94._0_4_ + fVar14;
          auVar114._4_4_ = auVar94._4_4_ + fVar15;
          auVar114._8_4_ = auVar94._8_4_ + fVar16;
          auVar114._12_4_ = auVar94._12_4_ + fVar17;
          auVar114._16_4_ = auVar94._16_4_ + fVar18;
          auVar114._20_4_ = auVar94._20_4_ + fVar19;
          auVar114._24_4_ = auVar94._24_4_ + fVar20;
          auVar114._28_4_ = auVar94._28_4_ + local_b40._28_4_;
          fVar120 = local_c00._0_4_;
          fVar122 = local_c00._4_4_;
          auVar46._4_4_ = auVar110._4_4_ * fVar122;
          auVar46._0_4_ = auVar110._0_4_ * fVar120;
          fVar125 = local_c00._8_4_;
          auVar46._8_4_ = auVar110._8_4_ * fVar125;
          fVar23 = local_c00._12_4_;
          auVar46._12_4_ = auVar110._12_4_ * fVar23;
          fVar26 = local_c00._16_4_;
          auVar46._16_4_ = auVar110._16_4_ * fVar26;
          fVar29 = local_c00._20_4_;
          auVar46._20_4_ = auVar110._20_4_ * fVar29;
          fVar32 = local_c00._24_4_;
          auVar46._24_4_ = auVar110._24_4_ * fVar32;
          auVar46._28_4_ = fVar116;
          auVar91 = vfmsub231ps_fma(auVar46,local_bc0,auVar114);
          local_be0 = vsubps_avx(auVar135,auVar87);
          fVar116 = local_be0._0_4_;
          fVar123 = local_be0._4_4_;
          auVar47._4_4_ = auVar114._4_4_ * fVar123;
          auVar47._0_4_ = auVar114._0_4_ * fVar116;
          fVar21 = local_be0._8_4_;
          auVar47._8_4_ = auVar114._8_4_ * fVar21;
          fVar24 = local_be0._12_4_;
          auVar47._12_4_ = auVar114._12_4_ * fVar24;
          fVar27 = local_be0._16_4_;
          auVar47._16_4_ = auVar114._16_4_ * fVar27;
          fVar30 = local_be0._20_4_;
          auVar47._20_4_ = auVar114._20_4_ * fVar30;
          fVar33 = local_be0._24_4_;
          auVar47._24_4_ = auVar114._24_4_ * fVar33;
          auVar47._28_4_ = auVar114._28_4_;
          auVar134._0_4_ = auVar87._0_4_ + auVar135._0_4_;
          auVar134._4_4_ = auVar87._4_4_ + auVar135._4_4_;
          auVar134._8_4_ = auVar87._8_4_ + auVar135._8_4_;
          auVar134._12_4_ = auVar87._12_4_ + auVar135._12_4_;
          auVar134._16_4_ = auVar87._16_4_ + auVar135._16_4_;
          auVar134._20_4_ = auVar87._20_4_ + auVar135._20_4_;
          auVar134._24_4_ = auVar87._24_4_ + auVar135._24_4_;
          auVar134._28_4_ = auVar87._28_4_ + auVar135._28_4_;
          auVar86 = vfmsub231ps_fma(auVar47,local_c00,auVar134);
          fVar121 = local_bc0._0_4_;
          fVar124 = local_bc0._4_4_;
          auVar48._4_4_ = auVar134._4_4_ * fVar124;
          auVar48._0_4_ = auVar134._0_4_ * fVar121;
          fVar22 = local_bc0._8_4_;
          auVar48._8_4_ = auVar134._8_4_ * fVar22;
          fVar25 = local_bc0._12_4_;
          auVar48._12_4_ = auVar134._12_4_ * fVar25;
          fVar28 = local_bc0._16_4_;
          auVar48._16_4_ = auVar134._16_4_ * fVar28;
          fVar31 = local_bc0._20_4_;
          auVar48._20_4_ = auVar134._20_4_ * fVar31;
          fVar34 = local_bc0._24_4_;
          auVar48._24_4_ = auVar134._24_4_ * fVar34;
          auVar48._28_4_ = auVar134._28_4_;
          auVar92 = vfmsub231ps_fma(auVar48,local_be0,auVar110);
          auVar49._4_4_ = auVar92._4_4_ * fVar4;
          auVar49._0_4_ = auVar92._0_4_ * fVar4;
          auVar49._8_4_ = auVar92._8_4_ * fVar4;
          auVar49._12_4_ = auVar92._12_4_ * fVar4;
          auVar49._16_4_ = fVar4 * 0.0;
          auVar49._20_4_ = fVar4 * 0.0;
          auVar49._24_4_ = fVar4 * 0.0;
          auVar49._28_4_ = local_c00._28_4_;
          auVar86 = vfmadd231ps_fma(auVar49,auVar147,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar130,ZEXT1632(auVar91));
          auVar40 = vsubps_avx(auVar87,auVar107);
          auVar102._0_4_ = auVar87._0_4_ + auVar107._0_4_;
          auVar102._4_4_ = auVar87._4_4_ + auVar107._4_4_;
          auVar102._8_4_ = auVar87._8_4_ + auVar107._8_4_;
          auVar102._12_4_ = auVar87._12_4_ + auVar107._12_4_;
          auVar102._16_4_ = auVar87._16_4_ + auVar107._16_4_;
          auVar102._20_4_ = auVar87._20_4_ + auVar107._20_4_;
          auVar102._24_4_ = auVar87._24_4_ + auVar107._24_4_;
          auVar102._28_4_ = auVar87._28_4_ + auVar107._28_4_;
          auVar107 = vsubps_avx(auVar88,auVar108);
          auVar119._0_4_ = auVar88._0_4_ + auVar108._0_4_;
          auVar119._4_4_ = auVar88._4_4_ + auVar108._4_4_;
          auVar119._8_4_ = auVar88._8_4_ + auVar108._8_4_;
          auVar119._12_4_ = auVar88._12_4_ + auVar108._12_4_;
          auVar119._16_4_ = auVar88._16_4_ + auVar108._16_4_;
          auVar119._20_4_ = auVar88._20_4_ + auVar108._20_4_;
          auVar119._24_4_ = auVar88._24_4_ + auVar108._24_4_;
          auVar119._28_4_ = auVar88._28_4_ + auVar108._28_4_;
          auVar108 = vsubps_avx(auVar94,auVar39);
          auVar95._0_4_ = auVar94._0_4_ + auVar39._0_4_;
          auVar95._4_4_ = auVar94._4_4_ + auVar39._4_4_;
          auVar95._8_4_ = auVar94._8_4_ + auVar39._8_4_;
          auVar95._12_4_ = auVar94._12_4_ + auVar39._12_4_;
          auVar95._16_4_ = auVar94._16_4_ + auVar39._16_4_;
          auVar95._20_4_ = auVar94._20_4_ + auVar39._20_4_;
          auVar95._24_4_ = auVar94._24_4_ + auVar39._24_4_;
          auVar95._28_4_ = auVar94._28_4_ + auVar39._28_4_;
          auVar126._0_4_ = auVar108._0_4_ * auVar119._0_4_;
          auVar126._4_4_ = auVar108._4_4_ * auVar119._4_4_;
          auVar126._8_4_ = auVar108._8_4_ * auVar119._8_4_;
          auVar126._12_4_ = auVar108._12_4_ * auVar119._12_4_;
          auVar126._16_4_ = auVar108._16_4_ * auVar119._16_4_;
          auVar126._20_4_ = auVar108._20_4_ * auVar119._20_4_;
          auVar126._24_4_ = auVar108._24_4_ * auVar119._24_4_;
          auVar126._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar126,auVar107,auVar95);
          auVar39._4_4_ = auVar95._4_4_ * auVar40._4_4_;
          auVar39._0_4_ = auVar95._0_4_ * auVar40._0_4_;
          auVar39._8_4_ = auVar95._8_4_ * auVar40._8_4_;
          auVar39._12_4_ = auVar95._12_4_ * auVar40._12_4_;
          auVar39._16_4_ = auVar95._16_4_ * auVar40._16_4_;
          auVar39._20_4_ = auVar95._20_4_ * auVar40._20_4_;
          auVar39._24_4_ = auVar95._24_4_ * auVar40._24_4_;
          auVar39._28_4_ = auVar95._28_4_;
          auVar91 = vfmsub231ps_fma(auVar39,auVar108,auVar102);
          auVar50._4_4_ = auVar102._4_4_ * auVar107._4_4_;
          auVar50._0_4_ = auVar102._0_4_ * auVar107._0_4_;
          auVar50._8_4_ = auVar102._8_4_ * auVar107._8_4_;
          auVar50._12_4_ = auVar102._12_4_ * auVar107._12_4_;
          auVar50._16_4_ = auVar102._16_4_ * auVar107._16_4_;
          auVar50._20_4_ = auVar102._20_4_ * auVar107._20_4_;
          auVar50._24_4_ = auVar102._24_4_ * auVar107._24_4_;
          auVar50._28_4_ = auVar102._28_4_;
          auVar93 = vfmsub231ps_fma(auVar50,auVar40,auVar119);
          auVar103._0_4_ = fVar4 * auVar93._0_4_;
          auVar103._4_4_ = fVar4 * auVar93._4_4_;
          auVar103._8_4_ = fVar4 * auVar93._8_4_;
          auVar103._12_4_ = fVar4 * auVar93._12_4_;
          auVar103._16_4_ = fVar4 * 0.0;
          auVar103._20_4_ = fVar4 * 0.0;
          auVar103._24_4_ = fVar4 * 0.0;
          auVar103._28_4_ = 0;
          auVar91 = vfmadd231ps_fma(auVar103,auVar147,ZEXT1632(auVar91));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar130,ZEXT1632(auVar92));
          local_ae0 = auVar38._0_4_;
          fStack_adc = auVar38._4_4_;
          fStack_ad8 = auVar38._8_4_;
          fStack_ad4 = auVar38._12_4_;
          local_aa0 = ZEXT1632(CONCAT412(auVar91._12_4_ + fStack_ad4 + auVar86._12_4_,
                                         CONCAT48(auVar91._8_4_ + fStack_ad8 + auVar86._8_4_,
                                                  CONCAT44(auVar91._4_4_ +
                                                           fStack_adc + auVar86._4_4_,
                                                           auVar91._0_4_ + local_ae0 + auVar86._0_4_
                                                          ))));
          auVar96._8_4_ = 0x7fffffff;
          auVar96._0_8_ = 0x7fffffff7fffffff;
          auVar96._12_4_ = 0x7fffffff;
          auVar96._16_4_ = 0x7fffffff;
          auVar96._20_4_ = 0x7fffffff;
          auVar96._24_4_ = 0x7fffffff;
          auVar96._28_4_ = 0x7fffffff;
          local_c20 = ZEXT1632(auVar38);
          auVar87 = vminps_avx(local_c20,ZEXT1632(auVar86));
          auVar87 = vminps_avx(auVar87,ZEXT1632(auVar91));
          local_c40 = vandps_avx(local_aa0,auVar96);
          fVar131 = local_c40._0_4_ * 1.1920929e-07;
          fVar136 = local_c40._4_4_ * 1.1920929e-07;
          auVar51._4_4_ = fVar136;
          auVar51._0_4_ = fVar131;
          fVar137 = local_c40._8_4_ * 1.1920929e-07;
          auVar51._8_4_ = fVar137;
          fVar138 = local_c40._12_4_ * 1.1920929e-07;
          auVar51._12_4_ = fVar138;
          fVar139 = local_c40._16_4_ * 1.1920929e-07;
          auVar51._16_4_ = fVar139;
          fVar140 = local_c40._20_4_ * 1.1920929e-07;
          auVar51._20_4_ = fVar140;
          fVar141 = local_c40._24_4_ * 1.1920929e-07;
          auVar51._24_4_ = fVar141;
          auVar51._28_4_ = 0x34000000;
          auVar127._0_8_ = CONCAT44(fVar136,fVar131) ^ 0x8000000080000000;
          auVar127._8_4_ = -fVar137;
          auVar127._12_4_ = -fVar138;
          auVar127._16_4_ = -fVar139;
          auVar127._20_4_ = -fVar140;
          auVar127._24_4_ = -fVar141;
          auVar127._28_4_ = 0xb4000000;
          auVar87 = vcmpps_avx(auVar87,auVar127,5);
          auVar94 = vmaxps_avx(local_c20,ZEXT1632(auVar86));
          auVar88 = vmaxps_avx(auVar94,ZEXT1632(auVar91));
          auVar88 = vcmpps_avx(auVar88,auVar51,2);
          auVar88 = vorps_avx(auVar87,auVar88);
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar52._4_4_ = local_b80._4_4_ * fVar124;
            auVar52._0_4_ = local_b80._0_4_ * fVar121;
            auVar52._8_4_ = local_b80._8_4_ * fVar22;
            auVar52._12_4_ = local_b80._12_4_ * fVar25;
            auVar52._16_4_ = local_b80._16_4_ * fVar28;
            auVar52._20_4_ = local_b80._20_4_ * fVar31;
            auVar52._24_4_ = local_b80._24_4_ * fVar34;
            auVar52._28_4_ = auVar87._28_4_;
            auVar53._4_4_ = fVar123 * local_ba0._4_4_;
            auVar53._0_4_ = fVar116 * local_ba0._0_4_;
            auVar53._8_4_ = fVar21 * local_ba0._8_4_;
            auVar53._12_4_ = fVar24 * local_ba0._12_4_;
            auVar53._16_4_ = fVar27 * local_ba0._16_4_;
            auVar53._20_4_ = fVar30 * local_ba0._20_4_;
            auVar53._24_4_ = fVar33 * local_ba0._24_4_;
            auVar53._28_4_ = 0x34000000;
            auVar38 = vfmsub213ps_fma(local_ba0,local_c00,auVar52);
            auVar54._4_4_ = fVar122 * auVar107._4_4_;
            auVar54._0_4_ = fVar120 * auVar107._0_4_;
            auVar54._8_4_ = fVar125 * auVar107._8_4_;
            auVar54._12_4_ = fVar23 * auVar107._12_4_;
            auVar54._16_4_ = fVar26 * auVar107._16_4_;
            auVar54._20_4_ = fVar29 * auVar107._20_4_;
            auVar54._24_4_ = fVar32 * auVar107._24_4_;
            auVar54._28_4_ = auVar94._28_4_;
            auVar145._0_4_ = fVar116 * auVar108._0_4_;
            auVar145._4_4_ = fVar123 * auVar108._4_4_;
            auVar145._8_4_ = fVar21 * auVar108._8_4_;
            auVar145._12_4_ = fVar24 * auVar108._12_4_;
            auVar145._16_4_ = fVar27 * auVar108._16_4_;
            auVar145._20_4_ = fVar30 * auVar108._20_4_;
            auVar145._24_4_ = fVar33 * auVar108._24_4_;
            auVar145._28_4_ = 0;
            auVar91 = vfmsub213ps_fma(auVar108,local_bc0,auVar54);
            auVar87 = vandps_avx(auVar52,auVar96);
            auVar94 = vandps_avx(auVar54,auVar96);
            auVar87 = vcmpps_avx(auVar87,auVar94,1);
            local_a80 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar38),auVar87);
            auVar55._4_4_ = auVar40._4_4_ * fVar124;
            auVar55._0_4_ = auVar40._0_4_ * fVar121;
            auVar55._8_4_ = auVar40._8_4_ * fVar22;
            auVar55._12_4_ = auVar40._12_4_ * fVar25;
            auVar55._16_4_ = auVar40._16_4_ * fVar28;
            auVar55._20_4_ = auVar40._20_4_ * fVar31;
            auVar55._24_4_ = auVar40._24_4_ * fVar34;
            auVar55._28_4_ = auVar87._28_4_;
            auVar38 = vfmsub213ps_fma(auVar40,local_c00,auVar145);
            auVar56._4_4_ = local_b60._4_4_ * fVar122;
            auVar56._0_4_ = local_b60._0_4_ * fVar120;
            auVar56._8_4_ = local_b60._8_4_ * fVar125;
            auVar56._12_4_ = local_b60._12_4_ * fVar23;
            auVar56._16_4_ = local_b60._16_4_ * fVar26;
            auVar56._20_4_ = local_b60._20_4_ * fVar29;
            auVar56._24_4_ = local_b60._24_4_ * fVar32;
            auVar56._28_4_ = auVar94._28_4_;
            auVar91 = vfmsub213ps_fma(local_b80,local_be0,auVar56);
            auVar87 = vandps_avx(auVar56,auVar96);
            auVar94 = vandps_avx(auVar145,auVar96);
            auVar87 = vcmpps_avx(auVar87,auVar94,1);
            local_a60 = vblendvps_avx(ZEXT1632(auVar38),ZEXT1632(auVar91),auVar87);
            auVar38 = vfmsub213ps_fma(local_b60,local_bc0,auVar53);
            auVar91 = vfmsub213ps_fma(auVar107,local_be0,auVar55);
            auVar87 = vandps_avx(auVar53,auVar96);
            auVar94 = vandps_avx(auVar55,auVar96);
            auVar87 = vcmpps_avx(auVar87,auVar94,1);
            local_a40 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar38),auVar87);
            auVar38 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            fVar116 = local_a40._0_4_;
            auVar97._0_4_ = fVar116 * fVar4;
            fVar120 = local_a40._4_4_;
            auVar97._4_4_ = fVar120 * fVar4;
            fVar121 = local_a40._8_4_;
            auVar97._8_4_ = fVar121 * fVar4;
            fVar122 = local_a40._12_4_;
            auVar97._12_4_ = fVar122 * fVar4;
            fVar123 = local_a40._16_4_;
            auVar97._16_4_ = fVar123 * fVar4;
            fVar124 = local_a40._20_4_;
            auVar97._20_4_ = fVar124 * fVar4;
            fVar125 = local_a40._24_4_;
            auVar97._24_4_ = fVar125 * fVar4;
            auVar97._28_4_ = 0;
            auVar91 = vfmadd213ps_fma(auVar147,local_a60,auVar97);
            auVar91 = vfmadd213ps_fma(auVar130,local_a80,ZEXT1632(auVar91));
            auVar94 = ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                         CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                  CONCAT44(auVar91._4_4_ + auVar91._4_4_,
                                                           auVar91._0_4_ + auVar91._0_4_))));
            auVar57._4_4_ = fVar120 * fVar15;
            auVar57._0_4_ = fVar116 * fVar14;
            auVar57._8_4_ = fVar121 * fVar16;
            auVar57._12_4_ = fVar122 * fVar17;
            auVar57._16_4_ = fVar123 * fVar18;
            auVar57._20_4_ = fVar124 * fVar19;
            auVar57._24_4_ = fVar125 * fVar20;
            auVar57._28_4_ = auVar88._28_4_;
            auVar91 = vfmadd213ps_fma(auVar101,local_a60,auVar57);
            auVar92 = vfmadd213ps_fma(auVar135,local_a80,ZEXT1632(auVar91));
            auVar87 = vrcpps_avx(auVar94);
            auVar148._8_4_ = 0x3f800000;
            auVar148._0_8_ = &DAT_3f8000003f800000;
            auVar148._12_4_ = 0x3f800000;
            auVar148._16_4_ = 0x3f800000;
            auVar148._20_4_ = 0x3f800000;
            auVar148._24_4_ = 0x3f800000;
            auVar148._28_4_ = 0x3f800000;
            auVar91 = vfnmadd213ps_fma(auVar87,auVar94,auVar148);
            auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar87,auVar87);
            local_9c0 = ZEXT1632(CONCAT412(auVar91._12_4_ * (auVar92._12_4_ + auVar92._12_4_),
                                           CONCAT48(auVar91._8_4_ * (auVar92._8_4_ + auVar92._8_4_),
                                                    CONCAT44(auVar91._4_4_ *
                                                             (auVar92._4_4_ + auVar92._4_4_),
                                                             auVar91._0_4_ *
                                                             (auVar92._0_4_ + auVar92._0_4_)))));
            uVar82 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar135._4_4_ = uVar82;
            auVar135._0_4_ = uVar82;
            auVar135._8_4_ = uVar82;
            auVar135._12_4_ = uVar82;
            auVar135._16_4_ = uVar82;
            auVar135._20_4_ = uVar82;
            auVar135._24_4_ = uVar82;
            auVar135._28_4_ = uVar82;
            uVar82 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar146._4_4_ = uVar82;
            auVar146._0_4_ = uVar82;
            auVar146._8_4_ = uVar82;
            auVar146._12_4_ = uVar82;
            auVar146._16_4_ = uVar82;
            auVar146._20_4_ = uVar82;
            auVar146._24_4_ = uVar82;
            auVar146._28_4_ = uVar82;
            auVar87 = vcmpps_avx(auVar135,local_9c0,2);
            auVar88 = vcmpps_avx(local_9c0,auVar146,2);
            auVar87 = vandps_avx(auVar87,auVar88);
            auVar91 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
            auVar38 = vpand_avx(auVar91,auVar38);
            auVar87 = vpmovsxwd_avx2(auVar38);
            if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0x7f,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0xbf,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar87[0x1f] < '\0') {
              auVar87 = vcmpps_avx(auVar94,_DAT_02020f00,4);
              auVar91 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
              auVar38 = vpand_avx(auVar38,auVar91);
              local_a20 = vpmovsxwd_avx2(auVar38);
              if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_a20 >> 0x7f,0) != '\0') ||
                    (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_a20 >> 0xbf,0) != '\0') ||
                  (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_a20[0x1f] < '\0') {
                uStack_ad0 = 0;
                uStack_acc = 0;
                uStack_ac8 = 0;
                uStack_ac4 = 0;
                local_ac0 = ZEXT1632(auVar86);
                local_940 = local_c60;
                auVar87 = vrcpps_avx(local_aa0);
                auVar115._8_4_ = 0x3f800000;
                auVar115._0_8_ = &DAT_3f8000003f800000;
                auVar115._12_4_ = 0x3f800000;
                auVar115._16_4_ = 0x3f800000;
                auVar115._20_4_ = 0x3f800000;
                auVar115._24_4_ = 0x3f800000;
                auVar115._28_4_ = 0x3f800000;
                auVar91 = vfnmadd213ps_fma(local_aa0,auVar87,auVar115);
                auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar87,auVar87);
                auVar104._8_4_ = 0x219392ef;
                auVar104._0_8_ = 0x219392ef219392ef;
                auVar104._12_4_ = 0x219392ef;
                auVar104._16_4_ = 0x219392ef;
                auVar104._20_4_ = 0x219392ef;
                auVar104._24_4_ = 0x219392ef;
                auVar104._28_4_ = 0x219392ef;
                auVar87 = vcmpps_avx(local_c40,auVar104,5);
                auVar87 = vandps_avx(auVar87,ZEXT1632(auVar91));
                auVar58._4_4_ = fStack_adc * auVar87._4_4_;
                auVar58._0_4_ = local_ae0 * auVar87._0_4_;
                auVar58._8_4_ = fStack_ad8 * auVar87._8_4_;
                auVar58._12_4_ = fStack_ad4 * auVar87._12_4_;
                auVar58._16_4_ = auVar87._16_4_ * 0.0;
                auVar58._20_4_ = auVar87._20_4_ * 0.0;
                auVar58._24_4_ = auVar87._24_4_ * 0.0;
                auVar58._28_4_ = 0;
                auVar88 = vminps_avx(auVar58,auVar115);
                auVar59._4_4_ = auVar86._4_4_ * auVar87._4_4_;
                auVar59._0_4_ = auVar86._0_4_ * auVar87._0_4_;
                auVar59._8_4_ = auVar86._8_4_ * auVar87._8_4_;
                auVar59._12_4_ = auVar86._12_4_ * auVar87._12_4_;
                auVar59._16_4_ = auVar87._16_4_ * 0.0;
                auVar59._20_4_ = auVar87._20_4_ * 0.0;
                auVar59._24_4_ = auVar87._24_4_ * 0.0;
                auVar59._28_4_ = auVar87._28_4_;
                auVar87 = vminps_avx(auVar59,auVar115);
                auVar94 = vsubps_avx(auVar115,auVar88);
                auVar135 = vsubps_avx(auVar115,auVar87);
                local_9e0 = vblendvps_avx(auVar87,auVar94,local_c60);
                local_a00 = vblendvps_avx(auVar88,auVar135,local_c60);
                local_980._4_4_ = (float)local_c80._4_4_ * local_a60._4_4_;
                local_980._0_4_ = (float)local_c80._0_4_ * local_a60._0_4_;
                local_980._8_4_ = fStack_c78 * local_a60._8_4_;
                local_980._12_4_ = fStack_c74 * local_a60._12_4_;
                local_980._16_4_ = fStack_c70 * local_a60._16_4_;
                local_980._20_4_ = fStack_c6c * local_a60._20_4_;
                local_980._24_4_ = fStack_c68 * local_a60._24_4_;
                local_980._28_4_ = local_9e0._28_4_;
                local_9a0[0] = local_a80._0_4_ * (float)local_c80._0_4_;
                local_9a0[1] = local_a80._4_4_ * (float)local_c80._4_4_;
                local_9a0[2] = local_a80._8_4_ * fStack_c78;
                local_9a0[3] = local_a80._12_4_ * fStack_c74;
                fStack_990 = local_a80._16_4_ * fStack_c70;
                fStack_98c = local_a80._20_4_ * fStack_c6c;
                fStack_988 = local_a80._24_4_ * fStack_c68;
                uStack_984 = local_a00._28_4_;
                local_960[0] = (float)local_c80._0_4_ * fVar116;
                local_960[1] = (float)local_c80._4_4_ * fVar120;
                local_960[2] = fStack_c78 * fVar121;
                local_960[3] = fStack_c74 * fVar122;
                fStack_950 = fStack_c70 * fVar123;
                fStack_94c = fStack_c6c * fVar124;
                fStack_948 = fStack_c68 * fVar125;
                uStack_944 = uStack_c64;
                auVar38 = vpacksswb_avx(auVar38,auVar38);
                uVar81 = (ulong)(byte)(SUB161(auVar38 >> 7,0) & 1 |
                                       (SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar38 >> 0x3f,0) << 7);
                do {
                  uVar42 = 0;
                  for (uVar76 = uVar81; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000
                      ) {
                    uVar42 = uVar42 + 1;
                  }
                  uVar72 = *(uint *)((long)&local_b00 + uVar42 * 4);
                  pGVar12 = (pSVar6->geometries).items[uVar72].ptr;
                  if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar81 = uVar81 ^ 1L << (uVar42 & 0x3f);
                    bVar85 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar85 = false;
                  }
                  else {
                    uVar82 = *(undefined4 *)(ray + k * 4 + 0x100);
                    uVar76 = (ulong)(uint)((int)uVar42 * 4);
                    local_8c0 = *(undefined4 *)(local_a00 + uVar76);
                    uVar5 = *(undefined4 *)(local_9e0 + uVar76);
                    local_8a0._4_4_ = uVar5;
                    local_8a0._0_4_ = uVar5;
                    local_8a0._8_4_ = uVar5;
                    local_8a0._12_4_ = uVar5;
                    local_8a0._16_4_ = uVar5;
                    local_8a0._20_4_ = uVar5;
                    local_8a0._24_4_ = uVar5;
                    local_8a0._28_4_ = uVar5;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar76);
                    local_cf0.context = context->user;
                    local_880 = *(undefined4 *)((long)&local_b20 + uVar76);
                    local_920 = *(undefined4 *)((long)local_9a0 + uVar76);
                    uVar5 = *(undefined4 *)(local_980 + uVar76);
                    local_900._4_4_ = uVar5;
                    local_900._0_4_ = uVar5;
                    local_900._8_4_ = uVar5;
                    local_900._12_4_ = uVar5;
                    local_900._16_4_ = uVar5;
                    local_900._20_4_ = uVar5;
                    local_900._24_4_ = uVar5;
                    local_900._28_4_ = uVar5;
                    uVar5 = *(undefined4 *)((long)local_960 + uVar76);
                    local_8e0._4_4_ = uVar5;
                    local_8e0._0_4_ = uVar5;
                    local_8e0._8_4_ = uVar5;
                    local_8e0._12_4_ = uVar5;
                    local_8e0._16_4_ = uVar5;
                    local_8e0._20_4_ = uVar5;
                    local_8e0._24_4_ = uVar5;
                    local_8e0._28_4_ = uVar5;
                    local_860._4_4_ = uVar72;
                    local_860._0_4_ = uVar72;
                    local_860._8_4_ = uVar72;
                    local_860._12_4_ = uVar72;
                    local_860._16_4_ = uVar72;
                    local_860._20_4_ = uVar72;
                    local_860._24_4_ = uVar72;
                    local_860._28_4_ = uVar72;
                    uStack_91c = local_920;
                    uStack_918 = local_920;
                    uStack_914 = local_920;
                    uStack_910 = local_920;
                    uStack_90c = local_920;
                    uStack_908 = local_920;
                    uStack_904 = local_920;
                    uStack_8bc = local_8c0;
                    uStack_8b8 = local_8c0;
                    uStack_8b4 = local_8c0;
                    uStack_8b0 = local_8c0;
                    uStack_8ac = local_8c0;
                    uStack_8a8 = local_8c0;
                    uStack_8a4 = local_8c0;
                    uStack_87c = local_880;
                    uStack_878 = local_880;
                    uStack_874 = local_880;
                    uStack_870 = local_880;
                    uStack_86c = local_880;
                    uStack_868 = local_880;
                    uStack_864 = local_880;
                    auVar87 = vpcmpeqd_avx2(local_8a0,local_8a0);
                    uStack_83c = (local_cf0.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_cf0.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_cc0 = local_ca0._0_8_;
                    uStack_cb8 = local_ca0._8_8_;
                    uStack_cb0 = local_ca0._16_8_;
                    uStack_ca8 = local_ca0._24_8_;
                    local_cf0.valid = (int *)&local_cc0;
                    local_cf0.geometryUserPtr = pGVar12->userPtr;
                    local_cf0.hit = (RTCHitN *)&local_920;
                    local_cf0.N = 8;
                    local_cf0.ray = (RTCRayN *)ray;
                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar12->occlusionFilterN)(&local_cf0);
                      auVar98._8_56_ = extraout_var;
                      auVar98._0_8_ = extraout_XMM1_Qa;
                      auVar87 = vpcmpeqd_avx2(auVar98._0_32_,auVar98._0_32_);
                    }
                    auVar68._8_8_ = uStack_cb8;
                    auVar68._0_8_ = local_cc0;
                    auVar68._16_8_ = uStack_cb0;
                    auVar68._24_8_ = uStack_ca8;
                    auVar94 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar68);
                    auVar88 = auVar87 & ~auVar94;
                    if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar88 >> 0x7f,0) == '\0') &&
                          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar88 >> 0xbf,0) == '\0') &&
                        (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar88[0x1f]) {
                      auVar94 = auVar94 ^ auVar87;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&local_cf0);
                      }
                      auVar69._8_8_ = uStack_cb8;
                      auVar69._0_8_ = local_cc0;
                      auVar69._16_8_ = uStack_cb0;
                      auVar69._24_8_ = uStack_ca8;
                      auVar87 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar69);
                      auVar94 = auVar87 ^ _DAT_0205a980;
                      auVar105._8_4_ = 0xff800000;
                      auVar105._0_8_ = 0xff800000ff800000;
                      auVar105._12_4_ = 0xff800000;
                      auVar105._16_4_ = 0xff800000;
                      auVar105._20_4_ = 0xff800000;
                      auVar105._24_4_ = 0xff800000;
                      auVar105._28_4_ = 0xff800000;
                      auVar87 = vblendvps_avx(auVar105,*(undefined1 (*) [32])(local_cf0.ray + 0x100)
                                              ,auVar87);
                      *(undefined1 (*) [32])(local_cf0.ray + 0x100) = auVar87;
                    }
                    bVar66 = (auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar67 = (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar65 = (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar64 = SUB321(auVar94 >> 0x7f,0) == '\0';
                    bVar63 = (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar62 = SUB321(auVar94 >> 0xbf,0) == '\0';
                    bVar61 = (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar60 = -1 < auVar94[0x1f];
                    bVar85 = ((((((bVar66 && bVar67) && bVar65) && bVar64) && bVar63) && bVar62) &&
                             bVar61) && bVar60;
                    if (((((((bVar66 && bVar67) && bVar65) && bVar64) && bVar63) && bVar62) &&
                        bVar61) && bVar60) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar82;
                      uVar81 = uVar81 ^ 1L << (uVar42 & 0x3f);
                    }
                  }
                  if (!bVar85) {
                    uVar72 = 0;
                    if (bVar84) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar72 = 1;
                    }
                    goto LAB_005fd528;
                  }
                } while (uVar81 != 0);
              }
            }
          }
          uVar72 = 0;
          uVar77 = uVar77 + 1;
          bVar84 = uVar77 < uVar73;
        } while (uVar77 != uVar73);
      }
    }
LAB_005fd528:
  } while ((uVar72 & 3) == 0);
  return puVar70 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }